

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.c
# Opt level: O1

ztresult_t bandmember_saver(void *pvoidval,char *buf,size_t bufsz)

{
  char **ppcVar1;
  long lVar2;
  ztresult_t zVar3;
  
  ppcVar1 = popular_beat_combo;
  lVar2 = 0;
  do {
    if (*ppcVar1 == *pvoidval) goto LAB_00101574;
    lVar2 = lVar2 + 1;
    ppcVar1 = ppcVar1 + 1;
  } while (lVar2 != 4);
  lVar2 = 4;
LAB_00101574:
  zVar3 = 0x80;
  if ((int)lVar2 != 4) {
    zVar3 = 0;
    sprintf(buf,"%d");
  }
  return zVar3;
}

Assistant:

static ztresult_t bandmember_saver(const void *pvoidval,
                                   char       *buf,
                                   size_t      bufsz)
{
  const char **ppcharval = (const char **) pvoidval;
  int          i;

  for (i = 0; i < NELEMS(popular_beat_combo); i++)
    if (popular_beat_combo[i] == *ppcharval)
      break;
  if (i == NELEMS(popular_beat_combo))
    return ztresult_BAD_POINTER;

  sprintf(buf, "%d", i);
  return ztresult_OK;
}